

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

char * upb_MtDataEncoder_StartOneof(upb_MtDataEncoder *e,char *ptr)

{
  char cVar1;
  upb_MtDataEncoderInternal *puVar2;
  upb_MtDataEncoderInternal *in;
  char *ptr_local;
  upb_MtDataEncoder *e_local;
  
  puVar2 = upb_MtDataEncoder_GetInternal(e,ptr);
  if ((puVar2->state).msg_state.oneof_state == kUpb_OneofState_NotStarted) {
    cVar1 = _upb_FromBase92('^');
    in = (upb_MtDataEncoderInternal *)upb_MtDataEncoder_Put(e,ptr,cVar1);
  }
  else {
    cVar1 = _upb_FromBase92('~');
    in = (upb_MtDataEncoderInternal *)upb_MtDataEncoder_Put(e,ptr,cVar1);
  }
  (puVar2->state).msg_state.oneof_state = kUpb_OneofState_StartedOneof;
  return (char *)in;
}

Assistant:

char* upb_MtDataEncoder_StartOneof(upb_MtDataEncoder* e, char* ptr) {
  upb_MtDataEncoderInternal* in = upb_MtDataEncoder_GetInternal(e, ptr);
  if (in->state.msg_state.oneof_state == kUpb_OneofState_NotStarted) {
    ptr = upb_MtDataEncoder_Put(e, ptr, _upb_FromBase92(kUpb_EncodedValue_End));
  } else {
    ptr = upb_MtDataEncoder_Put(
        e, ptr, _upb_FromBase92(kUpb_EncodedValue_OneofSeparator));
  }
  in->state.msg_state.oneof_state = kUpb_OneofState_StartedOneof;
  return ptr;
}